

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_2>::Write_First_Frame(Driver<float,_2> *this,int frame)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if (this->example->first_frame == frame) {
    File_Utilities::Create_Directory(&this->example->output_directory);
    std::operator+(&bStack_58,&this->example->output_directory,"/common");
    File_Utilities::Create_Directory(&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::operator+(&bStack_58,&this->example->output_directory,"/common/first_frame");
    std::__cxx11::to_string(&local_38,frame);
    File_Utilities::Write_To_Text_File<std::__cxx11::string>(&bStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_First_Frame(const int frame) const
{
    if(frame==example.first_frame)
    {
        File_Utilities::Create_Directory(example.output_directory);
        File_Utilities::Create_Directory(example.output_directory+"/common");
        File_Utilities::Write_To_Text_File(example.output_directory+"/common/first_frame",std::to_string(frame));
    }
}